

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O1

IStrategy * __thiscall xmrig::Pools::createStrategy(Pools *this,IStrategyListener *listener)

{
  pointer pPVar1;
  Pool *pPVar2;
  bool bVar3;
  bool bVar4;
  pointer pPVar5;
  FailoverStrategy *this_00;
  Pool *pool_1;
  long lVar6;
  Pool *this_01;
  Pool *pool;
  Pool *pool_2;
  
  pPVar5 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar5 != pPVar1) {
    lVar6 = 0;
    do {
      bVar3 = Pool::isEnabled(pPVar5);
      lVar6 = lVar6 + (ulong)bVar3;
      pPVar5 = pPVar5 + 1;
    } while (pPVar5 != pPVar1);
    if (lVar6 == 1) {
      pPVar2 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (this_01 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>.
                     _M_impl.super__Vector_impl_data._M_start; bVar3 = this_01 != pPVar2, bVar3;
          this_01 = this_01 + 1) {
        bVar4 = Pool::isEnabled(this_01);
        if (bVar4) {
          pPVar5 = (pointer)operator_new(0x28);
          SinglePoolStrategy::SinglePoolStrategy
                    ((SinglePoolStrategy *)pPVar5,this_01,this->m_retryPause,this->m_retries,
                     listener,false);
          break;
        }
      }
      if (bVar3) {
        return (IStrategy *)pPVar5;
      }
    }
  }
  this_00 = (FailoverStrategy *)operator_new(0x48);
  FailoverStrategy::FailoverStrategy(this_00,this->m_retryPause,this->m_retries,listener,false);
  pPVar1 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pPVar5 = (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl
                .super__Vector_impl_data._M_start; pPVar5 != pPVar1; pPVar5 = pPVar5 + 1) {
    bVar3 = Pool::isEnabled(pPVar5);
    if (bVar3) {
      FailoverStrategy::add(this_00,pPVar5);
    }
  }
  return &this_00->super_IStrategy;
}

Assistant:

xmrig::IStrategy *xmrig::Pools::createStrategy(IStrategyListener *listener) const
{
    if (active() == 1) {
        for (const Pool &pool : m_data) {
            if (pool.isEnabled()) {
                return new SinglePoolStrategy(pool, retryPause(), retries(), listener);
            }
        }
    }

    auto strategy = new FailoverStrategy(retryPause(), retries(), listener);
    for (const Pool &pool : m_data) {
        if (pool.isEnabled()) {
            strategy->add(pool);
        }
    }

    return strategy;
}